

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdAddImm(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg reg1;
  x86Reg sourceReg;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._1_1_ = cmd.rA;
  ctx_local._2_1_ = cmd.rB;
  ctx_local._4_4_ = cmd.argument;
  if (ctx_local._1_1_ == ctx_local._2_1_) {
    reg1 = CodeGenGenericContext::FindRegAtMemory
                     (&ctx->ctx,sQWORD,rNONE,1,rEBX,(uint)ctx_local._1_1_ << 3,true);
    if (reg1 == rRegCount) {
      EMIT_OP_RPTR_NUM(&ctx->ctx,o_add,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3,ctx_local._4_4_);
    }
    else {
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
      EMIT_OP_REG_NUM(&ctx->ctx,o_add,reg1,ctx_local._4_4_);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3,reg1);
    }
  }
  else {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uint)ctx_local._2_1_ << 3);
    CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    EMIT_OP_REG_NUM(&ctx->ctx,o_add,rEAX,ctx_local._4_4_);
    EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3,rEAX);
  }
  return;
}

Assistant:

void GenCodeCmdAddImm(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{

	if(cmd.rA == cmd.rB)
	{
		x86Reg sourceReg = ctx.ctx.FindRegAtMemory(sQWORD, rNONE, 1, rREG, cmd.rA * 8, true);

		if(sourceReg == rRegCount)
		{
			EMIT_OP_RPTR_NUM(ctx.ctx, o_add, sDWORD, rREG, cmd.rA * 8, cmd.argument); // Modify inplace
		}
		else
		{
			ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

			EMIT_OP_REG_NUM(ctx.ctx, o_add, sourceReg, cmd.argument); // Modify inplace
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, sourceReg); // Store int to target
		}
	}
	else
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rB * 8); // Load value

		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		EMIT_OP_REG_NUM(ctx.ctx, o_add, rEAX, cmd.argument);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store to target
	}
}